

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall
pfederc::StringToken::StringToken
          (StringToken *this,Token *last,TokenType type,Position *pos,string *str)

{
  string *str_local;
  Position *pos_local;
  TokenType type_local;
  Token *last_local;
  StringToken *this_local;
  
  Token::Token(&this->super_Token,last,type,pos);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__StringToken_0017f620;
  std::__cxx11::string::string((string *)&this->str,(string *)str);
  return;
}

Assistant:

StringToken::StringToken(Token *last, TokenType type, const Position &pos,
            const std::string &str) noexcept
    : Token(last, type, pos), str(str) {
}